

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O0

char * Kit_PlaFromTruth(void *p,uint *pTruth,int nVars,Vec_Int_t *vCover)

{
  int iVar1;
  int RetValue;
  char *pSop;
  Aig_MmFlex_t *pMan;
  Vec_Int_t *vCover_local;
  int nVars_local;
  uint *pTruth_local;
  void *p_local;
  
  iVar1 = Kit_TruthIsConst0(pTruth,nVars);
  if (iVar1 == 0) {
    iVar1 = Kit_TruthIsConst1(pTruth,nVars);
    if (iVar1 == 0) {
      iVar1 = Kit_TruthIsop(pTruth,nVars,vCover,0);
      if ((iVar1 != 0) && (iVar1 != 1)) {
        __assert_fail("RetValue == 0 || RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitPla.c"
                      ,0x15b,"char *Kit_PlaFromTruth(void *, unsigned int *, int, Vec_Int_t *)");
      }
      p_local = Kit_PlaCreateFromIsop(p,nVars,vCover);
      if (iVar1 != 0) {
        Kit_PlaComplement((char *)p_local);
      }
    }
    else {
      p_local = Kit_PlaStoreSop(p," 1\n");
    }
  }
  else {
    p_local = Kit_PlaStoreSop(p," 0\n");
  }
  return (char *)p_local;
}

Assistant:

char * Kit_PlaFromTruth( void * p, unsigned * pTruth, int nVars, Vec_Int_t * vCover )
{
    Aig_MmFlex_t * pMan = (Aig_MmFlex_t *)p;
    char * pSop;
    int RetValue;
    if ( Kit_TruthIsConst0(pTruth, nVars) )
        return Kit_PlaStoreSop( pMan, " 0\n" );
    if ( Kit_TruthIsConst1(pTruth, nVars) )
        return Kit_PlaStoreSop( pMan, " 1\n" );
    RetValue = Kit_TruthIsop( pTruth, nVars, vCover, 0 ); // 1 );
    assert( RetValue == 0 || RetValue == 1 );
    pSop = Kit_PlaCreateFromIsop( pMan, nVars, vCover );
    if ( RetValue )
        Kit_PlaComplement( pSop );
    return pSop;
}